

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O2

bool __thiscall
flatbuffers::FlatCompiler::RegisterCodeGenerator
          (FlatCompiler *this,FlatCOption *option,
          shared_ptr<flatbuffers::CodeGenerator> *code_generator)

{
  string *__rhs;
  bool bVar1;
  iterator iVar2;
  __shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Base_ptr *pp_Var4;
  _Rb_tree_node_base *p_Var5;
  pointer p_Var6;
  _Rb_tree_node_base *p_Var7;
  FlatCOption local_230;
  FlatCOption local_1b0;
  FlatCOption local_130;
  FlatCOption local_b0;
  
  if ((option->short_opt)._M_string_length != 0) {
    std::operator+(&local_230.short_opt,"-",&option->short_opt);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
                    *)this,&local_230.short_opt);
    std::__cxx11::string::~string((string *)&local_230);
    if ((_Rb_tree_header *)iVar2._M_node !=
        &(this->code_generators_)._M_t._M_impl.super__Rb_tree_header) {
      std::operator+(&local_230.short_opt,"multiple generators registered under: -",
                     &option->short_opt);
      (*(this->params_).error_fn)(this,&local_230.short_opt,false,false);
      goto LAB_00227107;
    }
    if ((option->short_opt)._M_string_length != 0) {
      std::operator+(&local_230.short_opt,"-",&option->short_opt);
      p_Var3 = &std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
                ::operator[](&this->code_generators_,&local_230.short_opt)->
                super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>::operator=
                (p_Var3,&code_generator->
                         super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>)
      ;
      std::__cxx11::string::~string((string *)&local_230);
    }
  }
  if ((option->long_opt)._M_string_length != 0) {
    __rhs = &option->long_opt;
    std::operator+(&local_230.short_opt,"--",__rhs);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
                    *)this,&local_230.short_opt);
    std::__cxx11::string::~string((string *)&local_230);
    if ((_Rb_tree_header *)iVar2._M_node !=
        &(this->code_generators_)._M_t._M_impl.super__Rb_tree_header) {
      std::operator+(&local_230.short_opt,"multiple generators registered under: --",__rhs);
      (*(this->params_).error_fn)(this,&local_230.short_opt,false,false);
LAB_00227107:
      std::__cxx11::string::~string((string *)&local_230);
      return false;
    }
    if ((option->long_opt)._M_string_length != 0) {
      std::operator+(&local_230.short_opt,"--",__rhs);
      p_Var3 = &std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
                ::operator[](&this->code_generators_,&local_230.short_opt)->
                super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>::operator=
                (p_Var3,&code_generator->
                         super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>)
      ;
      std::__cxx11::string::~string((string *)&local_230);
    }
  }
  bVar1 = true;
  pp_Var4 = (_Base_ptr *)(language_options + 0x10);
  p_Var7 = (_Rb_tree_node_base *)(language_options + 8);
  while (p_Var5 = *pp_Var4, p_Var5 != (_Rb_tree_node_base *)0x0) {
    FlatCOption::FlatCOption(&local_230,option);
    FlatCOption::FlatCOption(&local_1b0,(FlatCOption *)(p_Var5 + 1));
    bVar1 = std::operator<(&local_230.long_opt,&local_1b0.long_opt);
    FlatCOption::~FlatCOption(&local_1b0);
    FlatCOption::~FlatCOption(&local_230);
    p_Var7 = p_Var5;
    pp_Var4 = &p_Var5->_M_left + !bVar1;
  }
  p_Var5 = p_Var7;
  if (bVar1 != false) {
    if (p_Var7 == (_Rb_tree_node_base *)language_options._24_8_) goto LAB_0022724f;
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var7);
  }
  FlatCOption::FlatCOption(&local_b0,(FlatCOption *)(p_Var5 + 1));
  FlatCOption::FlatCOption(&local_130,option);
  bVar1 = std::operator<(&local_b0.long_opt,&local_130.long_opt);
  FlatCOption::~FlatCOption(&local_130);
  FlatCOption::~FlatCOption(&local_b0);
  if (!bVar1) {
    return true;
  }
LAB_0022724f:
  if (p_Var7 == (_Rb_tree_node_base *)(language_options + 8)) {
    bVar1 = true;
  }
  else {
    FlatCOption::FlatCOption(&local_230,option);
    FlatCOption::FlatCOption(&local_1b0,(FlatCOption *)(p_Var7 + 1));
    bVar1 = std::operator<(&local_230.long_opt,&local_1b0.long_opt);
    FlatCOption::~FlatCOption(&local_1b0);
    FlatCOption::~FlatCOption(&local_230);
  }
  p_Var6 = std::allocator_traits<std::allocator<std::_Rb_tree_node<flatbuffers::FlatCOption>_>_>::
           allocate((allocator_type *)language_options,1);
  FlatCOption::FlatCOption((FlatCOption *)&p_Var6->_M_storage,option);
  std::_Rb_tree_insert_and_rebalance
            (bVar1,&p_Var6->super__Rb_tree_node_base,p_Var7,
             (_Rb_tree_node_base *)(language_options + 8));
  language_options._40_8_ = language_options._40_8_ + 1;
  return true;
}

Assistant:

bool FlatCompiler::RegisterCodeGenerator(
    const FlatCOption &option, std::shared_ptr<CodeGenerator> code_generator) {
  if (!option.short_opt.empty() &&
      code_generators_.find("-" + option.short_opt) != code_generators_.end()) {
    Error("multiple generators registered under: -" + option.short_opt, false,
          false);
    return false;
  }

  if (!option.short_opt.empty()) {
    code_generators_["-" + option.short_opt] = code_generator;
  }

  if (!option.long_opt.empty() &&
      code_generators_.find("--" + option.long_opt) != code_generators_.end()) {
    Error("multiple generators registered under: --" + option.long_opt, false,
          false);
    return false;
  }

  if (!option.long_opt.empty()) {
    code_generators_["--" + option.long_opt] = code_generator;
  }

  language_options.insert(option);

  return true;
}